

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall ChainstateManager::ResetChainstates(ChainstateManager *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>::reset
            ((__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> *)this,(pointer)0x0);
  std::__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>::reset
            ((__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> *)
             &this->m_snapshot_chainstate,(pointer)0x0);
  this->m_active_chainstate = (Chainstate *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::ResetChainstates()
{
    m_ibd_chainstate.reset();
    m_snapshot_chainstate.reset();
    m_active_chainstate = nullptr;
}